

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

PolymorphicInlineCache * __thiscall
Js::FunctionBody::CreateNewPolymorphicInlineCache
          (FunctionBody *this,uint index,PropertyId propertyId,InlineCache *inlineCache)

{
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  PolymorphicInlineCache *pPVar4;
  undefined4 *puVar5;
  FunctionBodyPolymorphicInlineCache *inlineCache_00;
  Type *pTVar6;
  ulong uVar7;
  
  pPVar4 = InlineCachePointerArray<Js::PolymorphicInlineCache>::GetInlineCache
                     (&this->polymorphicInlineCaches,this,index);
  if (pPVar4 != (PolymorphicInlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1907,"(GetPolymorphicInlineCache(index) == nullptr)",
                                "GetPolymorphicInlineCache(index) == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar3 = GetCountField(this,RootObjectLoadInlineCacheStart);
  if ((index < uVar3) &&
     (bVar2 = Phases::IsEnabled((Phases *)&DAT_015bbe90,PolymorphicInlineCachePhase), !bVar2)) {
    recycler = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
    inlineCache_00 = FunctionBodyPolymorphicInlineCache::New(4,this);
    InlineCachePointerArray<Js::PolymorphicInlineCache>::SetInlineCache
              (&this->polymorphicInlineCaches,recycler,this,index,
               &inlineCache_00->super_PolymorphicInlineCache);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,PolymorphicInlineCachePhase);
    if ((bVar2) && (DAT_015d346a == '\x01')) {
      DumpFullFunctionName(this);
      Output::Print(L": New PIC, index = %d, size = %d\n",(ulong)index,4);
    }
    if ((undefined1  [24])((undefined1  [24])inlineCache->u & (undefined1  [24])0x1) ==
        (undefined1  [24])0x0) {
      if ((undefined1  [24])((undefined1  [24])inlineCache->u & (undefined1  [24])0x1) ==
          (undefined1  [24])0x0) {
        if ((undefined1  [24])((undefined1  [24])inlineCache->u & (undefined1  [24])0x1) ==
            (undefined1  [24])0x0) {
          pTVar6 = (Type *)0x0;
        }
        else {
          pTVar6 = (Type *)(inlineCache->u).proto.prototypeObject;
        }
      }
      else {
        pTVar6 = (inlineCache->u).local.typeWithoutProperty;
      }
    }
    else {
      pTVar6 = (inlineCache->u).local.type;
    }
    uVar7 = (ulong)(inlineCache_00->super_PolymorphicInlineCache).size + 0xffffffff &
            (ulong)pTVar6 >> 6;
    InlineCache::CopyTo(inlineCache,propertyId,
                        (this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext,
                        (inlineCache_00->super_PolymorphicInlineCache).inlineCaches +
                        (uVar7 & 0xffffffff));
    PolymorphicInlineCache::UpdateInlineCachesFillInfo
              (&inlineCache_00->super_PolymorphicInlineCache,(uint)uVar7,true);
    return &inlineCache_00->super_PolymorphicInlineCache;
  }
  return (PolymorphicInlineCache *)0x0;
}

Assistant:

PolymorphicInlineCache * FunctionBody::CreateNewPolymorphicInlineCache(uint index, PropertyId propertyId, InlineCache * inlineCache)
    {
        Assert(GetPolymorphicInlineCache(index) == nullptr);
        // Only create polymorphic inline caches for non-root inline cache indexes
        if (index < GetRootObjectLoadInlineCacheStart()
#if DBG
            && !PHASE_OFF1(Js::PolymorphicInlineCachePhase)
#endif
            )
        {
            PolymorphicInlineCache * polymorphicInlineCache = CreatePolymorphicInlineCache(index, MinPolymorphicInlineCacheSize);
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (PHASE_VERBOSE_TRACE1(Js::PolymorphicInlineCachePhase))
            {
                this->DumpFullFunctionName();
                Output::Print(_u(": New PIC, index = %d, size = %d\n"), index, MinPolymorphicInlineCacheSize);
            }

#endif
#if PHASE_PRINT_INTRUSIVE_TESTTRACE1
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
            PHASE_PRINT_INTRUSIVE_TESTTRACE1(
                Js::PolymorphicInlineCachePhase,
                _u("TestTrace PIC:  New, Function %s (%s), 0x%x, index = %d, size = %d\n"), this->GetDisplayName(), this->GetDebugNumberSet(debugStringBuffer), polymorphicInlineCache, index, MinPolymorphicInlineCacheSize);

            uint indexInPolymorphicCache = polymorphicInlineCache->GetInlineCacheIndexForType(inlineCache->GetType());
            inlineCache->CopyTo(propertyId, m_scriptContext, &(polymorphicInlineCache->GetInlineCaches()[indexInPolymorphicCache]));
            polymorphicInlineCache->UpdateInlineCachesFillInfo(indexInPolymorphicCache, true /*set*/);

            return polymorphicInlineCache;
        }
        return nullptr;
    }